

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

void __thiscall Button::setTextTexture(Button *this,Texture *tex)

{
  pointer pTVar1;
  Texture *tex_local;
  Button *this_local;
  
  pTVar1 = std::unique_ptr<rengine::Texture,_std::default_delete<rengine::Texture>_>::get
                     (&this->m_texture);
  if (pTVar1 != tex) {
    std::unique_ptr<rengine::Texture,_std::default_delete<rengine::Texture>_>::reset
              (&this->m_texture,tex);
    rengine::Node::requestPreprocess((Node *)this);
  }
  return;
}

Assistant:

void Button::setTextTexture(Texture *tex)
{
    if (m_texture.get() == tex)
        return;
    m_texture.reset(tex);
    requestPreprocess();
}